

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O2

string * test::loadPrivateKey_abi_cxx11_(void)

{
  string *in_RDI;
  path local_2d0;
  undefined1 local_2b0 [24];
  char *local_298;
  path local_290;
  path pkf;
  char *local_230;
  char *local_228;
  ifstream private_key_linux;
  int aiStack_200 [122];
  
  boost::filesystem::path::path
            ((path *)local_2b0,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test"
            );
  boost::filesystem::path::path(&local_2d0,"data");
  boost::filesystem::operator/((path *)&private_key_linux,(path *)local_2b0,&local_2d0);
  boost::filesystem::path::path(&local_290,"private_key.rsa");
  boost::filesystem::operator/(&pkf,(path *)&private_key_linux,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&private_key_linux);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)local_2b0);
  std::ifstream::ifstream(&private_key_linux,(string *)&pkf,_S_in);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/cryptohelper_test.cpp"
  ;
  local_228 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x27);
  local_2d0.m_pathname._M_dataplus._M_p._0_1_ =
       (string)(*(int *)((long)aiStack_200 + *(long *)(_private_key_linux + -0x18)) == 0);
  local_2d0.m_pathname._M_string_length = 0;
  local_2d0.m_pathname.field_2._M_allocated_capacity = 0;
  local_2b0[8] = 0;
  local_2b0._0_8_ = &PTR__lazy_ostream_00541ce0;
  local_2b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_298 = "test file found";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2d0.m_pathname.field_2._M_allocated_capacity);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>();
  std::ifstream::~ifstream(&private_key_linux);
  std::__cxx11::string::~string((string *)&pkf);
  return in_RDI;
}

Assistant:

const std::string loadPrivateKey() {
	fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
	std::ifstream private_key_linux(pkf.string());
	BOOST_REQUIRE_MESSAGE(private_key_linux.good(), "test file found");
	const std::string pk_str((std::istreambuf_iterator<char>(private_key_linux)), std::istreambuf_iterator<char>());
	return pk_str;
}